

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
initialize_with_string_view
          (basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          string_view_type sv,error_code *ec)

{
  int iVar1;
  type tVar2;
  
  tVar2 = unicode_traits::detect_encoding_from_bom<char>(sv._M_str,sv._M_len);
  if (utf8 < tVar2.encoding) {
    std::error_code::operator=(ec,illegal_unicode_character);
    return;
  }
  (this->parser_).begin_input_ = tVar2.ptr;
  (this->parser_).input_end_ = sv._M_str + sv._M_len;
  (this->parser_).input_ptr_ = tVar2.ptr;
  iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[8])(this,ec);
  return;
}

Assistant:

void initialize_with_string_view(string_view_type sv, std::error_code& ec)
    {
        auto r = unicode_traits::detect_encoding_from_bom(sv.data(), sv.size());
        if (!(r.encoding == unicode_traits::encoding_kind::utf8 || r.encoding == unicode_traits::encoding_kind::undetected))
        {
            ec = json_errc::illegal_unicode_character;
            return;
        }
        std::size_t offset = (r.ptr - sv.data());
        parser_.update(sv.data()+offset,sv.size()-offset);
        if (!done())
        {
            next(ec);
        }
    }